

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void do_cmd_zap_rod(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if (!_Var1) {
    cmd_set_repeat(L'\0');
    return;
  }
  wVar2 = cmd_get_item((command_conflict *)cmd,"item",&obj,"Zap which rod? ",
                       "You have no rods to zap.",tval_is_rod,L'F');
  if (wVar2 == L'\0') {
    _Var1 = obj_can_zap(obj);
    if (_Var1) {
      _Var1 = use_aux(cmd,obj,USE_TIMEOUT,L'\r');
      if (_Var1) {
        return;
      }
    }
    else {
      msg("That rod is still charging.");
    }
  }
  cmd_set_repeat(L'\0');
  return;
}

Assistant:

void do_cmd_zap_rod(struct command *cmd)
{
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		cmd_set_repeat(0);
		return;
	}

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Zap which rod? ",
			"You have no rods to zap.",
			tval_is_rod,
			USE_INVEN | USE_FLOOR | SHOW_FAIL) != CMD_OK) {
		cmd_set_repeat(0);
		return;
	}

	if (!obj_can_zap(obj)) {
		msg("That rod is still charging.");
		cmd_set_repeat(0);
		return;
	}

	/* Disable autorepetition when successful. */
	if (!use_aux(cmd, obj, USE_TIMEOUT, MSG_ZAP_ROD)) {
		cmd_set_repeat(0);
	}
}